

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDEdge::HasInteriorEdgeTopology(ON_SubDEdge *this,bool bRequireOppositeFaceDirections)

{
  ON_SubDFace *this_00;
  ON_SubDEdgePtr OVar1;
  ON_SubDEdgePtr OVar2;
  ON_SubDFace *this_01;
  ON_SubDEdgePtr feptr [2];
  ON_SubDFace *f [2];
  bool bRequireOppositeFaceDirections_local;
  ON_SubDEdge *this_local;
  
  if ((this->m_face_count == 2) &&
     ((!bRequireOppositeFaceDirections ||
      ((this->m_face2[0].m_ptr & 1) != (this->m_face2[1].m_ptr & 1))))) {
    this_01 = (ON_SubDFace *)(this->m_face2[0].m_ptr & 0xfffffffffffffff8);
    this_00 = (ON_SubDFace *)(this->m_face2[1].m_ptr & 0xfffffffffffffff8);
    if ((this_01 != (ON_SubDFace *)0x0) && ((this_00 != (ON_SubDFace *)0x0 && (this_01 != this_00)))
       ) {
      OVar1 = ON_SubDFace::EdgePtrFromEdge(this_01,this);
      OVar2 = ON_SubDFace::EdgePtrFromEdge(this_00,this);
      if (this == (ON_SubDEdge *)(OVar1.m_ptr & 0xfffffffffffffff8)) {
        if ((OVar1.m_ptr & 1) == (this->m_face2[0].m_ptr & 1)) {
          if (this == (ON_SubDEdge *)(OVar2.m_ptr & 0xfffffffffffffff8)) {
            if ((OVar2.m_ptr & 1) == (this->m_face2[1].m_ptr & 1)) {
              if (((this->m_vertex[0] != (ON_SubDVertex *)0x0) &&
                  (this->m_vertex[1] != (ON_SubDVertex *)0x0)) &&
                 (this->m_vertex[0] != this->m_vertex[1])) {
                return true;
              }
              ON_SubDIncrementErrorCount();
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                         ,0x19d7,"","m_vertex[] has null or invalid pointers.");
            }
            else {
              ON_SubDIncrementErrorCount();
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                         ,0x19d2,"","m_face2[1] has inconsistent direction flags.");
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                       ,0x19cd,"","m_face2[1] does not reference this edge.");
          }
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x19c8,"","m_face2[0] has inconsistent direction flags.");
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x19c3,"","m_face2[0] does not reference this edge.");
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdge::HasInteriorEdgeTopology(bool bRequireOppositeFaceDirections) const
{
  for (;;)
  {
    if (2 != m_face_count)
      break;
    if (bRequireOppositeFaceDirections && ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr) == ON_SUBD_FACE_DIRECTION(m_face2[1].m_ptr))
      break;
    const ON_SubDFace* f[2] = { ON_SUBD_FACE_POINTER(m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(m_face2[1].m_ptr) };
    if ( nullptr == f[0] || nullptr == f[1] || f[0] == f[1])
      break;
    const ON_SubDEdgePtr feptr[2] = { f[0]->EdgePtrFromEdge(this), f[1]->EdgePtrFromEdge(this) };
    if (this != ON_SUBD_EDGE_POINTER(feptr[0].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(feptr[0].m_ptr) != ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] has inconsistent direction flags.");
      break;
    }
    if (this != ON_SUBD_EDGE_POINTER(feptr[1].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[1] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(feptr[1].m_ptr) != ON_SUBD_FACE_DIRECTION(m_face2[1].m_ptr))
    {
      ON_SUBD_ERROR("m_face2[1] has inconsistent direction flags.");
      break;
    }
    if (nullptr == m_vertex[0] || nullptr == m_vertex[1] || m_vertex[0] == m_vertex[1])
    {
      ON_SUBD_ERROR("m_vertex[] has null or invalid pointers.");
      break;
    }
    return true;
  }
  return false;
}